

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset_util.h
# Opt level: O0

_Bool bitset_lenrange_empty(uint64_t *words,uint32_t start,uint32_t lenminusone)

{
  byte bVar1;
  uint uVar2;
  uint32_t i;
  uint32_t endword;
  uint32_t firstword;
  uint32_t lenminusone_local;
  uint32_t start_local;
  uint64_t *words_local;
  _Bool local_1;
  
  i = start >> 6;
  uVar2 = start + lenminusone >> 6;
  bVar1 = (byte)start;
  if (i == uVar2) {
    local_1 = (words[i] &
              (0xffffffffffffffffU >> (0x3fU - (char)lenminusone & 0x3f)) << (bVar1 & 0x3f)) == 0;
  }
  else if ((words[i] & -1L << (bVar1 & 0x3f)) == 0) {
    do {
      i = i + 1;
      if (uVar2 <= i) {
        if ((words[uVar2] & 0xffffffffffffffffU >> ((bVar1 ^ 0xff) - (char)lenminusone & 0x3f)) != 0
           ) {
          return false;
        }
        return true;
      }
    } while (words[i] == 0);
    local_1 = false;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

static inline bool bitset_lenrange_empty(const uint64_t *words, uint32_t start,
                                         uint32_t lenminusone) {
    uint32_t firstword = start / 64;
    uint32_t endword = (start + lenminusone) / 64;
    if (firstword == endword) {
        return (words[firstword] & ((~UINT64_C(0)) >> ((63 - lenminusone) % 64))
                                       << (start % 64)) == 0;
    }
    if (((words[firstword] & ((~UINT64_C(0)) << (start % 64)))) != 0) {
        return false;
    }
    for (uint32_t i = firstword + 1; i < endword; i++) {
        if (words[i] != 0) {
            return false;
        }
    }
    if ((words[endword] &
         (~UINT64_C(0)) >> (((~start + 1) - lenminusone - 1) % 64)) != 0) {
        return false;
    }
    return true;
}